

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_rsassa_pkcs1_v15_verify
              (mbedtls_rsa_context *ctx,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig
              )

{
  size_t __size;
  int iVar1;
  void *a;
  uchar *in_RCX;
  int in_EDX;
  int in_ESI;
  uchar *in_RDI;
  uchar *in_R8;
  uchar *encoded_expected;
  uchar *encoded;
  size_t sig_len;
  int ret;
  void *b;
  int local_2c;
  uint in_stack_fffffffffffffffc;
  
  b = (void *)0x0;
  if (((in_ESI == 0) && (in_EDX == 0)) || (in_RCX != (uchar *)0x0)) {
    __size = *(size_t *)(in_RDI + 8);
    a = calloc(1,__size);
    if ((a == (void *)0x0) || (b = calloc(1,__size), b == (void *)0x0)) {
      local_2c = -0x10;
    }
    else {
      local_2c = rsa_rsassa_pkcs1_v15_encode
                           ((mbedtls_md_type_t)encoded_expected,in_stack_fffffffffffffffc,in_RDI,
                            CONCAT44(in_ESI,in_EDX),in_RCX);
      if ((local_2c == 0) &&
         (local_2c = mbedtls_rsa_public((mbedtls_rsa_context *)CONCAT44(in_ESI,in_EDX),in_RCX,in_R8)
         , local_2c == 0)) {
        iVar1 = mbedtls_ct_memcmp(a,b,__size);
        if (iVar1 == 0) {
          local_2c = 0;
        }
        else {
          local_2c = -0x4380;
        }
      }
    }
    if (a != (void *)0x0) {
      mbedtls_zeroize_and_free(a,(size_t)b);
    }
    if (b != (void *)0x0) {
      mbedtls_zeroize_and_free(a,(size_t)b);
    }
  }
  else {
    local_2c = -0x4080;
  }
  return local_2c;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_verify(mbedtls_rsa_context *ctx,
                                        mbedtls_md_type_t md_alg,
                                        unsigned int hashlen,
                                        const unsigned char *hash,
                                        const unsigned char *sig)
{
    int ret = 0;
    size_t sig_len;
    unsigned char *encoded = NULL, *encoded_expected = NULL;

    if ((md_alg != MBEDTLS_MD_NONE || hashlen != 0) && hash == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    sig_len = ctx->len;

    /*
     * Prepare expected PKCS1 v1.5 encoding of hash.
     */

    if ((encoded          = (unsigned char*) mbedtls_calloc(1, sig_len)) == NULL ||
        (encoded_expected = (unsigned char*) mbedtls_calloc(1, sig_len)) == NULL) {
        ret = MBEDTLS_ERR_MPI_ALLOC_FAILED;
        goto cleanup;
    }

    if ((ret = rsa_rsassa_pkcs1_v15_encode(md_alg, hashlen, hash, sig_len,
                                           encoded_expected)) != 0) {
        goto cleanup;
    }

    /*
     * Apply RSA primitive to get what should be PKCS1 encoded hash.
     */

    ret = mbedtls_rsa_public(ctx, sig, encoded);
    if (ret != 0) {
        goto cleanup;
    }

    /*
     * Compare
     */

    if ((ret = mbedtls_ct_memcmp(encoded, encoded_expected,
                                 sig_len)) != 0) {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto cleanup;
    }

cleanup:

    if (encoded != NULL) {
        mbedtls_zeroize_and_free(encoded, sig_len);
    }

    if (encoded_expected != NULL) {
        mbedtls_zeroize_and_free(encoded_expected, sig_len);
    }

    return ret;
}